

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_update_image_data(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_data,opj_image_t *p_output_image)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  uint *puVar9;
  long in_RDX;
  uint *in_RSI;
  long in_RDI;
  OPJ_INT32 *l_src_ptr_2;
  OPJ_INT16 *l_src_ptr_1;
  OPJ_CHAR *l_src_ptr;
  opj_tcd_resolution_v2_t *l_res;
  OPJ_INT32 *l_dest_ptr;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 l_size_comp;
  opj_image_t *l_image_src;
  opj_tcd_tilecomp_v2_t *l_tilec;
  opj_image_comp_t *l_img_comp_dest;
  opj_image_comp_t *l_img_comp_src;
  OPJ_INT32 l_line_offset_dest;
  OPJ_INT32 l_start_offset_dest;
  OPJ_UINT32 l_y1_dest;
  OPJ_UINT32 l_x1_dest;
  OPJ_UINT32 l_y0_dest;
  OPJ_UINT32 l_x0_dest;
  OPJ_UINT32 l_start_y_dest;
  OPJ_UINT32 l_start_x_dest;
  OPJ_INT32 l_end_offset_src;
  OPJ_INT32 l_line_offset_src;
  OPJ_INT32 l_start_offset_src;
  OPJ_INT32 l_offset_y1_src;
  OPJ_INT32 l_offset_x1_src;
  OPJ_INT32 l_offset_y0_src;
  OPJ_INT32 l_offset_x0_src;
  OPJ_UINT32 l_height_dest;
  OPJ_UINT32 l_width_dest;
  OPJ_UINT32 l_height_src;
  OPJ_UINT32 l_width_src;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  uint *local_c8;
  ushort *local_c0;
  byte *local_b8;
  uint *local_a8;
  uint local_9c;
  long local_90;
  long local_88;
  long local_80;
  int local_60;
  int local_5c;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint *local_18;
  
  local_90 = *(long *)(**(long **)(in_RDI + 0x18) + 0x18);
  lVar1 = *(long *)(in_RDI + 0x20);
  local_80 = *(long *)(lVar1 + 0x18);
  local_88 = *(long *)(in_RDX + 0x18);
  local_24 = 0;
  local_18 = in_RSI;
  while( true ) {
    if (*(uint *)(lVar1 + 0x10) <= local_24) {
      return 1;
    }
    if (*(long *)(local_88 + 0x30) == 0) {
      pvVar8 = calloc((ulong)(uint)(*(int *)(local_88 + 8) * *(int *)(local_88 + 0xc)),4);
      *(void **)(local_88 + 0x30) = pvVar8;
      if (*(long *)(local_88 + 0x30) == 0) {
        return 0;
      }
    }
    *(undefined4 *)(local_88 + 0x24) = *(undefined4 *)(local_80 + 0x24);
    local_9c = *(uint *)(local_80 + 0x18) >> 3;
    puVar9 = (uint *)(*(long *)(local_90 + 0x18) + (ulong)*(uint *)(local_80 + 0x24) * 0xb0);
    if ((*(uint *)(local_80 + 0x18) & 7) != 0) {
      local_9c = local_9c + 1;
    }
    if (local_9c == 3) {
      local_9c = 4;
    }
    uVar2 = puVar9[2] - *puVar9;
    uVar3 = puVar9[3] - puVar9[1];
    uVar4 = int_ceildivpow2(*(int *)(local_88 + 0x10),*(int *)(local_88 + 0x28));
    uVar5 = int_ceildivpow2(*(int *)(local_88 + 0x14),*(int *)(local_88 + 0x28));
    local_38 = uVar4 + *(int *)(local_88 + 8);
    local_3c = uVar5 + *(int *)(local_88 + 0xc);
    if (uVar4 < *puVar9) {
      local_5c = *puVar9 - uVar4;
      local_40 = 0;
      if (local_38 < puVar9[2]) {
        local_38 = local_38 - *puVar9;
        local_48 = uVar2 - local_38;
      }
      else {
        local_48 = 0;
        local_38 = uVar2;
      }
    }
    else {
      local_5c = 0;
      local_40 = uVar4 - *puVar9;
      if (local_38 < puVar9[2]) {
        local_48 = puVar9[2] - local_38;
        local_38 = *(uint *)(local_88 + 8);
      }
      else {
        local_48 = 0;
        local_38 = uVar2 - local_40;
      }
    }
    if (uVar5 < puVar9[1]) {
      local_60 = puVar9[1] - uVar5;
      local_44 = 0;
      if (local_3c < puVar9[3]) {
        local_3c = local_3c - puVar9[1];
        local_4c = uVar3 - local_3c;
      }
      else {
        local_4c = 0;
        local_3c = uVar3;
      }
    }
    else {
      local_60 = 0;
      local_44 = uVar5 - puVar9[1];
      if (local_3c < puVar9[3]) {
        local_4c = puVar9[3] - local_3c;
        local_3c = *(uint *)(local_88 + 0xc);
      }
      else {
        local_4c = 0;
        local_3c = uVar3 - local_44;
      }
    }
    if ((((local_40 < 0) || (local_44 < 0)) || (local_48 < 0)) || (local_4c < 0)) break;
    iVar6 = local_40 + local_44 * uVar2;
    local_48 = local_48 + local_40;
    local_40 = local_4c * uVar2 - local_40;
    iVar7 = *(int *)(local_88 + 8) - local_38;
    local_a8 = (uint *)(*(long *)(local_88 + 0x30) +
                       (long)(local_5c + local_60 * *(int *)(local_88 + 8)) * 4);
    if (local_9c == 1) {
      local_b8 = (byte *)((long)local_18 + (long)iVar6);
      if (*(int *)(local_80 + 0x20) == 0) {
        for (local_28 = 0; local_28 < local_3c; local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
            *local_a8 = (uint)*local_b8;
            local_b8 = local_b8 + 1;
            local_a8 = local_a8 + 1;
          }
          local_a8 = local_a8 + iVar7;
          local_b8 = local_b8 + local_48;
        }
      }
      else {
        for (local_28 = 0; local_28 < local_3c; local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
            *local_a8 = (int)(char)*local_b8;
            local_b8 = local_b8 + 1;
            local_a8 = local_a8 + 1;
          }
          local_a8 = local_a8 + iVar7;
          local_b8 = local_b8 + local_48;
        }
      }
      local_18 = (uint *)(local_b8 + local_40);
    }
    else if (local_9c == 2) {
      local_c0 = (ushort *)((long)local_18 + (long)iVar6 * 2);
      if (*(int *)(local_80 + 0x20) == 0) {
        for (local_28 = 0; local_28 < local_3c; local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
            *local_a8 = (uint)*local_c0;
            local_c0 = local_c0 + 1;
            local_a8 = local_a8 + 1;
          }
          local_a8 = local_a8 + iVar7;
          local_c0 = local_c0 + local_48;
        }
      }
      else {
        for (local_28 = 0; local_28 < local_3c; local_28 = local_28 + 1) {
          for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
            *local_a8 = (int)(short)*local_c0;
            local_c0 = local_c0 + 1;
            local_a8 = local_a8 + 1;
          }
          local_a8 = local_a8 + iVar7;
          local_c0 = local_c0 + local_48;
        }
      }
      local_18 = (uint *)(local_c0 + local_40);
    }
    else if (local_9c == 4) {
      local_c8 = local_18 + iVar6;
      for (local_28 = 0; local_28 < local_3c; local_28 = local_28 + 1) {
        for (local_2c = 0; local_2c < local_38; local_2c = local_2c + 1) {
          *local_a8 = *local_c8;
          local_c8 = local_c8 + 1;
          local_a8 = local_a8 + 1;
        }
        local_a8 = local_a8 + iVar7;
        local_c8 = local_c8 + local_48;
      }
      local_18 = local_c8 + local_40;
    }
    local_88 = local_88 + 0x38;
    local_80 = local_80 + 0x38;
    local_90 = local_90 + 0x38;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

opj_bool j2k_update_image_data (opj_tcd_v2_t * p_tcd, OPJ_BYTE * p_data, opj_image_t* p_output_image)
{
	OPJ_UINT32 i,j,k = 0;
	OPJ_UINT32 l_width_src,l_height_src;
	OPJ_UINT32 l_width_dest,l_height_dest;
	OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
	OPJ_INT32 l_start_offset_src, l_line_offset_src, l_end_offset_src ;
	OPJ_UINT32 l_start_x_dest , l_start_y_dest;
	OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
	OPJ_INT32 l_start_offset_dest, l_line_offset_dest;

	opj_image_comp_t * l_img_comp_src = 00;
	opj_image_comp_t * l_img_comp_dest = 00;

	opj_tcd_tilecomp_v2_t * l_tilec = 00;
	opj_image_t * l_image_src = 00;
	OPJ_UINT32 l_size_comp, l_remaining;
	OPJ_INT32 * l_dest_ptr;
	opj_tcd_resolution_v2_t* l_res= 00;

	l_tilec = p_tcd->tcd_image->tiles->comps;
	l_image_src = p_tcd->image;
	l_img_comp_src = l_image_src->comps;

	l_img_comp_dest = p_output_image->comps;

	for (i=0; i<l_image_src->numcomps; i++) {

		/* Allocate output component buffer if necessary */
		if (!l_img_comp_dest->data) {

			l_img_comp_dest->data = (OPJ_INT32*) opj_calloc(l_img_comp_dest->w * l_img_comp_dest->h, sizeof(OPJ_INT32));
			if (! l_img_comp_dest->data) {
				return OPJ_FALSE;
			}
		}

		/* Copy info from decoded comp image to output image */
		l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

		/*-----*/
		/* Compute the precision of the output buffer */
		l_size_comp = l_img_comp_src->prec >> 3; /*(/ 8)*/
		l_remaining = l_img_comp_src->prec & 7;  /* (%8) */
		l_res = l_tilec->resolutions + l_img_comp_src->resno_decoded;

		if (l_remaining) {
			++l_size_comp;
		}

		if (l_size_comp == 3) {
			l_size_comp = 4;
		}
		/*-----*/

		/* Current tile component size*/
		/*if (i == 0) {
		fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
				l_res->x0, l_res->x1, l_res->y0, l_res->y1);
		}*/

		l_width_src = (l_res->x1 - l_res->x0);
		l_height_src = (l_res->y1 - l_res->y0);

		/* Border of the current output component*/
		l_x0_dest = int_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
		l_y0_dest = int_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
		l_x1_dest = l_x0_dest + l_img_comp_dest->w;
		l_y1_dest = l_y0_dest + l_img_comp_dest->h;

		/*if (i == 0) {
		fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
				l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
		}*/

		/*-----*/
		/* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
		 * of the input buffer (decoded tile component) which will be move
		 * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
		 * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
		 * by this input area.
		 * */
		if ( l_x0_dest < l_res->x0 ) {
			l_start_x_dest = l_res->x0 - l_x0_dest;
			l_offset_x0_src = 0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_x1_dest - l_res->x0 ;
				l_offset_x1_src = l_width_src - l_width_dest;
			}
		}
		else {
			l_start_x_dest = 0 ;
			l_offset_x0_src = l_x0_dest - l_res->x0;

			if ( l_x1_dest >= l_res->x1 ) {
				l_width_dest = l_width_src - l_offset_x0_src;
				l_offset_x1_src = 0;
			}
			else {
				l_width_dest = l_img_comp_dest->w ;
				l_offset_x1_src = l_res->x1 - l_x1_dest;
			}
		}

		if ( l_y0_dest < l_res->y0 ) {
			l_start_y_dest = l_res->y0 - l_y0_dest;
			l_offset_y0_src = 0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_y1_dest - l_res->y0 ;
				l_offset_y1_src =  l_height_src - l_height_dest;
			}
		}
		else {
			l_start_y_dest = 0 ;
			l_offset_y0_src = l_y0_dest - l_res->y0;

			if ( l_y1_dest >= l_res->y1 ) {
				l_height_dest = l_height_src - l_offset_y0_src;
				l_offset_y1_src = 0;
			}
			else {
				l_height_dest = l_img_comp_dest->h ;
				l_offset_y1_src = l_res->y1 - l_y1_dest;
			}
		}

		if( (l_offset_x0_src < 0 ) || (l_offset_y0_src < 0 ) || (l_offset_x1_src < 0 ) || (l_offset_y1_src < 0 ) ){
			return OPJ_FALSE;
		}
		/*-----*/

		/* Compute the input buffer offset */
		l_start_offset_src = l_offset_x0_src + l_offset_y0_src * l_width_src;
		l_line_offset_src = l_offset_x1_src + l_offset_x0_src;
		l_end_offset_src = l_offset_y1_src * l_width_src - l_offset_x0_src;

		/* Compute the output buffer offset */
		l_start_offset_dest = l_start_x_dest + l_start_y_dest * l_img_comp_dest->w;
		l_line_offset_dest = l_img_comp_dest->w - l_width_dest;

		/* Move the output buffer to the first place where we will write*/
		l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

		/*if (i == 0) {
			fprintf(stdout, "COMPO[%d]:\n",i);
			fprintf(stdout, "SRC: l_start_x_src=%d, l_start_y_src=%d, l_width_src=%d, l_height_src=%d\n"
					"\t tile offset:%d, %d, %d, %d\n"
					"\t buffer offset: %d; %d, %d\n",
					l_res->x0, l_res->y0, l_width_src, l_height_src,
					l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src,
					l_start_offset_src, l_line_offset_src, l_end_offset_src);

			fprintf(stdout, "DEST: l_start_x_dest=%d, l_start_y_dest=%d, l_width_dest=%d, l_height_dest=%d\n"
					"\t start offset: %d, line offset= %d\n",
					l_start_x_dest, l_start_y_dest, l_width_dest, l_height_dest, l_start_offset_dest, l_line_offset_dest);
		}*/


		switch (l_size_comp) {
			case 1:
				{
					OPJ_CHAR * l_src_ptr = (OPJ_CHAR*) p_data;
					l_src_ptr += l_start_offset_src; /* Move to the first place where we will read*/

					if (l_img_comp_src->sgnd) {
						for (j = 0 ; j < l_height_dest ; ++j) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) (*(l_src_ptr++)); /* Copy only the data needed for the output image */
							}

							l_dest_ptr+= l_line_offset_dest; /* Move to the next place where we will write */
							l_src_ptr += l_line_offset_src ; /* Move to the next place where we will read */
						}
					}
					else {
						for ( j = 0 ; j < l_height_dest ; ++j ) {
							for ( k = 0 ; k < l_width_dest ; ++k) {
								*(l_dest_ptr++) = (OPJ_INT32) ((*(l_src_ptr++))&0xff);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src;
						}
					}

					l_src_ptr += l_end_offset_src; /* Move to the end of this component-part of the input buffer */
					p_data = (OPJ_BYTE*) l_src_ptr; /* Keep the current position for the next component-part */
				}
				break;
			case 2:
				{
					OPJ_INT16 * l_src_ptr = (OPJ_INT16 *) p_data;
					l_src_ptr += l_start_offset_src;

					if (l_img_comp_src->sgnd) {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = *(l_src_ptr++);
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}
					else {
						for (j=0;j<l_height_dest;++j) {
							for (k=0;k<l_width_dest;++k) {
								*(l_dest_ptr++) = (*(l_src_ptr++))&0xffff;
							}

							l_dest_ptr+= l_line_offset_dest;
							l_src_ptr += l_line_offset_src ;
						}
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
			case 4:
				{
					OPJ_INT32 * l_src_ptr = (OPJ_INT32 *) p_data;
					l_src_ptr += l_start_offset_src;

					for (j=0;j<l_height_dest;++j) {
						for (k=0;k<l_width_dest;++k) {
							*(l_dest_ptr++) = (*(l_src_ptr++));
						}

						l_dest_ptr+= l_line_offset_dest;
						l_src_ptr += l_line_offset_src ;
					}

					l_src_ptr += l_end_offset_src;
					p_data = (OPJ_BYTE*) l_src_ptr;
				}
				break;
		}

		++l_img_comp_dest;
		++l_img_comp_src;
		++l_tilec;
	}

	return OPJ_TRUE;
}